

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImgDisplay::_init_fullscreen(CImgDisplay *this)

{
  Display *pDVar1;
  undefined4 uVar2;
  X11_static *pXVar3;
  Window WVar4;
  undefined1 local_1d8 [8];
  XWindowAttributes attr;
  XEvent event;
  XSetWindowAttributes attr_set;
  uint sy;
  uint sx;
  Display *dpy;
  CImgDisplay *this_local;
  
  if (((this->_is_fullscreen & 1U) != 0) && ((this->_is_closed & 1U) == 0)) {
    pXVar3 = cimg::X11_attr();
    pDVar1 = pXVar3->display;
    this->_background_window = 0;
    attr_set.cursor._4_4_ = screen_width();
    attr_set.cursor._0_4_ = screen_height();
    if ((attr_set.cursor._4_4_ != this->_width) || ((uint)attr_set.cursor != this->_height)) {
      uVar2 = XDefaultScreen(pDVar1);
      attr_set.background_pixmap = XBlackPixel(pDVar1,uVar2);
      attr_set.do_not_propagate_mask._0_4_ = 1;
      WVar4 = XCreateWindow(pDVar1,*(undefined8 *)
                                    (*(long *)(pDVar1 + 0xe8) + (long)*(int *)(pDVar1 + 0xe0) * 0x80
                                    + 0x10),0,0,attr_set.cursor._4_4_,(uint)attr_set.cursor,0,0,1,0,
                            0x202,event.pad + 0x17);
      this->_background_window = WVar4;
      XSelectInput(pDVar1,this->_background_window,0x20000);
      XMapRaised(pDVar1,this->_background_window);
      do {
        XWindowEvent(pDVar1,this->_background_window,0x20000,&attr.screen);
      } while ((int)attr.screen != 0x13);
      do {
        XGetWindowAttributes(pDVar1,this->_background_window,local_1d8);
        if (attr.colormap._4_4_ != 2) {
          XSync(pDVar1,0);
          cimg::sleep(10);
        }
      } while (attr.colormap._4_4_ != 2);
    }
  }
  return;
}

Assistant:

void _init_fullscreen() {
      if (!_is_fullscreen || _is_closed) return;
      Display *const dpy = cimg::X11_attr().display;
      _background_window = 0;

#ifdef cimg_use_xrandr
      int foo;
      if (XRRQueryExtension(dpy,&foo,&foo)) {
        XRRRotations(dpy,DefaultScreen(dpy),&cimg::X11_attr().curr_rotation);
        if (!cimg::X11_attr().resolutions) {
          cimg::X11_attr().resolutions = XRRSizes(dpy,DefaultScreen(dpy),&foo);
          cimg::X11_attr().nb_resolutions = (unsigned int)foo;
        }
        if (cimg::X11_attr().resolutions) {
          cimg::X11_attr().curr_resolution = 0;
          for (unsigned int i = 0; i<cimg::X11_attr().nb_resolutions; ++i) {
            const unsigned int
              nw = (unsigned int)(cimg::X11_attr().resolutions[i].width),
              nh = (unsigned int)(cimg::X11_attr().resolutions[i].height);
            if (nw>=_width && nh>=_height &&
                nw<=(unsigned int)(cimg::X11_attr().resolutions[cimg::X11_attr().curr_resolution].width) &&
                nh<=(unsigned int)(cimg::X11_attr().resolutions[cimg::X11_attr().curr_resolution].height))
              cimg::X11_attr().curr_resolution = i;
          }
          if (cimg::X11_attr().curr_resolution>0) {
            XRRScreenConfiguration *config = XRRGetScreenInfo(dpy,DefaultRootWindow(dpy));
            XRRSetScreenConfig(dpy,config,DefaultRootWindow(dpy),
                               cimg::X11_attr().curr_resolution,cimg::X11_attr().curr_rotation,CurrentTime);
            XRRFreeScreenConfigInfo(config);
            XSync(dpy,0);
          }
        }
      }
      if (!cimg::X11_attr().resolutions)
        cimg::warn(_cimgdisplay_instance
                   "init_fullscreen(): Xrandr extension not supported by the X server.",
                   cimgdisplay_instance);
#endif

      const unsigned int sx = screen_width(), sy = screen_height();
      if (sx==_width && sy==_height) return;
      XSetWindowAttributes attr_set;

      attr_set.background_pixel = XBlackPixel(dpy,XDefaultScreen(dpy));
      attr_set.override_redirect = 1;
      _background_window = XCreateWindow(dpy,DefaultRootWindow(dpy),0,0,sx,sy,0,0,
                                         InputOutput,CopyFromParent,CWBackPixel | CWOverrideRedirect,&attr_set);
      XEvent event;
      XSelectInput(dpy,_background_window,StructureNotifyMask);
      XMapRaised(dpy,_background_window);
      do XWindowEvent(dpy,_background_window,StructureNotifyMask,&event);
      while (event.type!=MapNotify);

      XWindowAttributes attr;
      do {
        XGetWindowAttributes(dpy,_background_window,&attr);
        if (attr.map_state!=IsViewable) { XSync(dpy,0); cimg::sleep(10); }
      } while (attr.map_state!=IsViewable);
    }